

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O2

void ProcessThread::addPid(pid_t pid,Process *process,bool async)

{
  int returnCode;
  undefined1 this [8];
  iterator __it;
  Event *event;
  mapped_type *this_00;
  pid_t pid_local;
  undefined1 local_60 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2> local_48;
  
  pid_local = pid;
  std::mutex::lock(&sProcessMutex);
  sPending = sPending + -1;
  if (sPendingPids._M_h._M_element_count != 0) {
    __it = std::
           _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::find(&sPendingPids._M_h,&pid_local);
    if (__it.super__Node_iterator_base<std::pair<const_int,_int>,_false>._M_cur !=
        (__node_type *)0x0) {
      returnCode = *(int *)((long)__it.super__Node_iterator_base<std::pair<const_int,_int>,_false>.
                                  _M_cur + 0xc);
      if (async) {
        EventLoop::eventLoop();
        this = local_60;
        event = (Event *)operator_new(0x20);
        event->_vptr_Event = (_func_int **)&PTR__Event_001b57b0;
        event[1]._vptr_Event = (_func_int **)process;
        *(int *)&event[2]._vptr_Event = returnCode;
        EventLoop::post((EventLoop *)this,event);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
      }
      else {
        Process::finish(process,returnCode);
      }
      std::
      _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::erase(&sPendingPids._M_h,
              (const_iterator)
              __it.super__Node_iterator_base<std::pair<const_int,_int>,_false>._M_cur);
      goto LAB_0018e7f3;
    }
  }
  local_60 = (undefined1  [8])process;
  if (async) {
    EventLoop::eventLoop();
  }
  else {
    local_48._M_ptr = (element_type *)0x0;
    local_48._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  std::__weak_ptr<EventLoop,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<EventLoop,void>
            ((__weak_ptr<EventLoop,(__gnu_cxx::_Lock_policy)2> *)&local_58,&local_48);
  this_00 = std::
            map<int,_ProcessThread::ProcessData,_std::less<int>,_std::allocator<std::pair<const_int,_ProcessThread::ProcessData>_>_>
            ::operator[](&sProcesses,&pid_local);
  ProcessData::operator=(this_00,(ProcessData *)local_60);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
LAB_0018e7f3:
  if (sPending == 0) {
    std::
    _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(&sPendingPids._M_h);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&sProcessMutex);
  return;
}

Assistant:

void ProcessThread::addPid(pid_t pid, Process* process, bool async)
{
    std::lock_guard<std::mutex> lock(sProcessMutex);
    sPending -= 1;

    if (!sPendingPids.empty()) {
        // we have to check
        auto it = sPendingPids.find(pid);
        if (it != sPendingPids.end()) {
            // fire the signal now
            const int ret = it->second;
            if (async) {
                EventLoop::eventLoop()->callLater([process, ret]() { process->finish(ret); });
            } else {
                process->finish(ret);
            }
            sPendingPids.erase(it);
            if (!sPending)
                sPendingPids.clear();
            return;
        }
    }

    sProcesses[pid] = { process, async ? EventLoop::eventLoop() : EventLoop::SharedPtr() };

    if (!sPending)
        sPendingPids.clear();
}